

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_4,_3> *mat;
  Matrix<float,_4,_3> *mat_00;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined4 uVar9;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Type in0;
  Vector<float,_3> res;
  float afStack_118 [6];
  float local_100 [4];
  float local_f0 [2];
  ulong local_e8;
  undefined4 local_e0;
  float local_d8 [4];
  float local_c8 [4];
  float local_b8 [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Matrix<float,_4,_3> local_70;
  Matrix<float,_4,_3> local_40;
  long lVar7;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_98;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      auVar6 = _DAT_00a99400;
      do {
        bVar8 = SUB164(auVar6 ^ _DAT_00a99450,4) == -0x80000000 &&
                SUB164(auVar6 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar8) {
          uVar9 = 0x3f800000;
          if (lVar2 != lVar5) {
            uVar9 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar5 + -0x10) = uVar9;
        }
        if (bVar8) {
          uVar9 = 0x3f800000;
          if (lVar2 + -0x10 != lVar5) {
            uVar9 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar5) = uVar9;
        }
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x10;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar4 != 4);
    local_a8 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_a0 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_90 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_88 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_80 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    mat = (Matrix<float,_4,_3> *)0x4;
  }
  else {
    puVar1 = &local_a8;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat3x4;
    mat = (Matrix<float,_4,_3> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar2 * 4) = *(undefined4 *)((long)puVar3 + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0xc);
      mat = (Matrix<float,_4,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 3;
    } while (mat != (Matrix<float,_4,_3> *)0x4);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,4,3>
            (&local_40,(MatrixCaseUtils *)&local_a8,mat);
  local_f0[0] = local_40.m_data.m_data[0].m_data[0];
  local_f0[1] = local_40.m_data.m_data[0].m_data[1];
  local_e8 = CONCAT44(local_e8._4_4_,local_40.m_data.m_data[0].m_data[2]);
  afStack_118[2] = local_40.m_data.m_data[1].m_data[1];
  afStack_118[3] = local_40.m_data.m_data[1].m_data[2];
  afStack_118[4] = local_40.m_data.m_data[1].m_data[3];
  local_70.m_data.m_data[0].m_data[0] = 0.0;
  local_70.m_data.m_data[0].m_data[1] = 0.0;
  local_70.m_data.m_data[0].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    local_70.m_data.m_data[0].m_data[lVar2] = local_f0[lVar2] + afStack_118[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_100[0] = local_40.m_data.m_data[2].m_data[2];
  local_100[1] = local_40.m_data.m_data[2].m_data[3];
  local_100[2] = local_40.m_data.m_data[2].m_data[0];
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar2 = 0;
  do {
    local_c8[lVar2] = local_70.m_data.m_data[0].m_data[lVar2] + local_100[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,4,3>
            (&local_70,(MatrixCaseUtils *)&local_a8,mat_00);
  afStack_118[2] = local_70.m_data.m_data[0].m_data[0];
  afStack_118[3] = local_70.m_data.m_data[0].m_data[1];
  afStack_118[4] = local_70.m_data.m_data[0].m_data[2];
  local_100[0] = local_70.m_data.m_data[1].m_data[1];
  local_100[1] = local_70.m_data.m_data[1].m_data[2];
  local_100[2] = local_70.m_data.m_data[1].m_data[3];
  local_f0[0] = 0.0;
  local_f0[1] = 0.0;
  local_e8 = local_e8 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_f0[lVar2] = afStack_118[lVar2 + 2] + local_100[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8[0] = local_70.m_data.m_data[2].m_data[2];
  local_b8[1] = local_70.m_data.m_data[2].m_data[3];
  local_b8[2] = local_70.m_data.m_data[2].m_data[0];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar2 = 0;
  do {
    local_d8[lVar2] = local_f0[lVar2] + local_b8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_118[2] = 0.0;
  afStack_118[3] = 0.0;
  afStack_118[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_118[lVar2 + 2] = local_c8[lVar2] + local_d8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e8 = 0x100000000;
  local_e0 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_f0[lVar2]] = afStack_118[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}